

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

double __thiscall
Fl_Text_Display::measure_proportional_character(Fl_Text_Display *this,char *s,int xPix,int pos)

{
  char cVar1;
  int iVar2;
  int style;
  double dVar3;
  
  if (*s == '\t') {
    iVar2 = this->mBuffer->mTabDist;
    if ((this->mColumnScale == 0.0) && (!NAN(this->mColumnScale))) {
      x_to_col(this,0.0);
    }
    iVar2 = (int)((double)iVar2 * this->mColumnScale);
    return (double)((xPix / iVar2 + 1) * iVar2 - xPix);
  }
  iVar2 = fl_utf8len1(*s);
  if (this->mStyleBuffer == (Fl_Text_Buffer *)0x0) {
    style = 0;
  }
  else {
    cVar1 = Fl_Text_Buffer::byte_at(this->mStyleBuffer,pos);
    style = (int)cVar1;
  }
  dVar3 = string_width(this,s,iVar2,style);
  return dVar3;
}

Assistant:

double Fl_Text_Display::measure_proportional_character(const char *s, int xPix, int pos) const {
  IS_UTF8_ALIGNED(s)

  if (*s=='\t') {
    int tab = (int)col_to_x(mBuffer->tab_distance());
    return (((xPix/tab)+1)*tab) - xPix;
  }

  int charLen = fl_utf8len1(*s), style = 0;
  if (mStyleBuffer) {
    style = mStyleBuffer->byte_at(pos);
  }
  return string_width(s, charLen, style);
}